

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTimestamp.cxx
# Opt level: O2

string * __thiscall
cmTimestamp::CurrentTime
          (string *__return_storage_ptr__,cmTimestamp *this,string *formatString,bool utcFlag)

{
  allocator<char> local_229;
  time_t currentTimeT;
  string source_date_epoch;
  string local_200;
  string local_1e0;
  uv_timeval64_t timeval;
  istringstream iss;
  uint auStack_190 [88];
  
  uv_gettimeofday(&timeval);
  currentTimeT = timeval.tv_sec;
  source_date_epoch._M_dataplus._M_p = (pointer)&source_date_epoch.field_2;
  source_date_epoch._M_string_length = 0;
  source_date_epoch.field_2._M_local_buf[0] = '\0';
  cmsys::SystemTools::GetEnv("SOURCE_DATE_EPOCH",&source_date_epoch);
  if (source_date_epoch._M_string_length != 0) {
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&iss,(string *)&source_date_epoch,_S_in);
    std::istream::_M_extract<long>((long *)&iss);
    if ((*(uint *)((long)auStack_190 + *(long *)(_iss + -0x18)) & 7) != 2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,"Cannot parse SOURCE_DATE_EPOCH as integer",&local_229);
      cmSystemTools::Error(&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      exit(0x1b);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
    timeval.tv_usec = 0;
    timeval.tv_sec = currentTimeT;
  }
  if (timeval.tv_sec == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string((string *)&local_200,(string *)formatString);
    CreateTimestampFromTimeT
              (__return_storage_ptr__,this,timeval.tv_sec,timeval.tv_usec,&local_200,utcFlag);
    std::__cxx11::string::~string((string *)&local_200);
  }
  std::__cxx11::string::~string((string *)&source_date_epoch);
  return __return_storage_ptr__;
}

Assistant:

std::string cmTimestamp::CurrentTime(const std::string& formatString,
                                     bool utcFlag) const
{
  // get current time with microsecond resolution
  uv_timeval64_t timeval;
  uv_gettimeofday(&timeval);
  auto currentTimeT = static_cast<time_t>(timeval.tv_sec);
  auto microseconds = static_cast<uint32_t>(timeval.tv_usec);

  // check for override via SOURCE_DATE_EPOCH for reproducible builds
  std::string source_date_epoch;
  cmSystemTools::GetEnv("SOURCE_DATE_EPOCH", source_date_epoch);
  if (!source_date_epoch.empty()) {
    std::istringstream iss(source_date_epoch);
    iss >> currentTimeT;
    if (iss.fail() || !iss.eof()) {
      cmSystemTools::Error("Cannot parse SOURCE_DATE_EPOCH as integer");
      exit(27);
    }
    // SOURCE_DATE_EPOCH has only a resolution in the seconds range
    microseconds = 0;
  }
  if (currentTimeT == static_cast<time_t>(-1)) {
    return std::string();
  }

  return this->CreateTimestampFromTimeT(currentTimeT, microseconds,
                                        formatString, utcFlag);
}